

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::createRandomTurnList(Chromosome *this)

{
  result_type_conflict2 rVar1;
  ulong uVar2;
  long lVar3;
  value_type local_1c;
  value_type local_18;
  int local_14;
  int turn;
  int i;
  Chromosome *this_local;
  
  local_14 = 0;
  _turn = this;
  while( true ) {
    uVar2 = (ulong)local_14;
    lVar3 = std::__cxx11::string::length();
    if (lVar3 - 1U <= uVar2) break;
    rVar1 = std::uniform_int_distribution<int>::operator()(&uniform_dist,&randomEngine);
    local_1c = rVar1 + LEFT;
    local_18 = local_1c;
    std::vector<TURNCODE,_std::allocator<TURNCODE>_>::push_back(&this->turnList,&local_1c);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Chromosome::createRandomTurnList() {
        for (int i = 0; i  < GeneticAlgorithm::params.sequence.length() - 1; i++ ){
            int turn = uniform_dist(randomEngine) - 1;
            turnList.push_back((TURNCODE)turn);
        }
}